

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

void vscode_unpack(int64_t i,PackedInteger *pi)

{
  int64_t mask;
  PackedInteger *pi_local;
  int64_t i_local;
  
  pi->x8[0] = (uint)(i & 0xff000000ffU);
  pi->x8[1] = (uint)((ulong)i >> 8) & 0xff;
  pi->x8[2] = (uint)((ulong)i >> 0x10) & 0xff;
  pi->x8[3] = (uint)((ulong)i >> 0x18) & 0xff;
  pi->x8[4] = (uint)((i & 0xff000000ffU) >> 0x20);
  pi->depth = (int)((uint)((ulong)i >> 0x20) & 0xff00) >> 8;
  pi->vartype = (int)(short)((ushort)((ulong)i >> 0x30) & 0xff) & 0xf;
  return;
}

Assistant:

void vscode_unpack(int64_t i, PackedInteger *pi) {
  int64_t mask = 0xFF;
  pi->x8[0] = (unsigned int)(i & mask); mask <<= 8;
  pi->x8[1] = (unsigned int)((i & mask) >> 8); mask <<= 8;
  pi->x8[2] = (unsigned int)((i & mask) >> 16); mask <<= 8;
  pi->x8[3] = (unsigned int)((i & mask) >> 24); mask <<= 8;
  pi->x8[4] = (unsigned int)((i & mask) >> 32); mask <<= 8;
  pi->depth = (unsigned int)((i & mask) >> 40); mask <<= 8;
  pi->vartype = (unsigned int)(((i & mask) >> 48) & 0x0F);
}